

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall mocker::ir::Builder::operator()(Builder *this,BinaryExpr *node)

{
  uint uVar1;
  OpType *k;
  element_type *peVar2;
  BuilderContext *pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  OpType *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long lVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<mocker::ir::Addr> sVar10;
  shared_ptr<mocker::ir::Reg> res;
  shared_ptr<mocker::ir::Reg> val_1;
  OpType op;
  shared_ptr<mocker::ir::Addr> lhsAddr;
  shared_ptr<mocker::ir::Addr> rhs;
  shared_ptr<mocker::ir::Addr> lhs;
  shared_ptr<mocker::ir::Addr> rhsVal;
  undefined1 local_200 [17];
  undefined4 uStack_1ef;
  undefined3 uStack_1eb;
  undefined4 local_1e8;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined2 local_1e2;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [16];
  code *local_1b8;
  code *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  shared_ptr<mocker::ir::Addr> local_178;
  shared_ptr<mocker::ir::Addr> local_168;
  shared_ptr<mocker::ir::Addr> local_158;
  OpType local_144 [5];
  undefined1 local_130 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_118;
  _Elt_pointer psStack_108;
  __node_base local_100;
  _Elt_pointer psStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  initializer_list<std::pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  if (node->op - Subscript < 2) {
    bVar6 = (this->ctx->logicalExprInfo).empty;
    (this->ctx->logicalExprInfo).empty = true;
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::ASTNode,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)local_200,
               (__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &(node->super_Expression).super_ASTNode.
                super_enable_shared_from_this<mocker::ast::ASTNode>);
    uVar4 = local_200._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
      }
    }
    local_130._0_8_ = local_200._0_8_;
    local_130._8_8_ = local_200._8_8_;
    getElementPtr((Builder *)(local_1e0 + 0x18),(shared_ptr<mocker::ast::ASTNode> *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar4 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
    }
    pBVar3 = this->ctx;
    (pBVar3->logicalExprInfo).empty = bVar6;
    local_130._0_8_ = (_Elt_pointer)(local_130 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"valOrInstPtr","");
    BuilderContext::makeTempLocalReg((BuilderContext *)local_200,(string *)pBVar3);
    if ((_Elt_pointer)local_130._0_8_ != (_Elt_pointer)(local_130 + 0x10)) {
      operator_delete((void *)local_130._0_8_,
                      (ulong)((long)(_List_node_base **)local_130._16_8_ + 1));
    }
    BuilderContext::
    emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,(shared_ptr<mocker::ir::Reg> *)local_200,
               (shared_ptr<mocker::ir::Addr> *)(local_1e0 + 0x18));
    pBVar3 = this->ctx;
    local_158.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_200._0_8_;
    local_158.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
      }
    }
    BuilderContext::setExprAddr(pBVar3,(NodeID)node,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1c8._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_1c8._8_8_;
    }
LAB_0013e582:
    if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar8);
    }
    return;
  }
  if (node->op == Assign) {
    peVar2 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
              (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    BuilderContext::getExprAddr((BuilderContext *)local_130,(NodeID)this->ctx);
    local_200._0_8_ =
         (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_200._8_8_ =
         (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
      }
    }
    getElementPtr((Builder *)(local_1e0 + 0x18),(shared_ptr<mocker::ast::ASTNode> *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
    }
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,(shared_ptr<mocker::ir::Addr> *)(local_1e0 + 0x18),
               (shared_ptr<mocker::ir::Addr> *)local_130);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_130._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130._8_8_;
    }
    goto LAB_0013e582;
  }
  k = &node->op;
  local_1b0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:126:15)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:126:15)>
              ::_M_manager;
  uVar1 = node->op - Eq;
  local_1c8._0_8_ = node;
  local_1c8._8_8_ = this;
  if (uVar1 < 6) {
    pBVar3 = this->ctx;
    local_1e0._20_4_ = uVar1;
    local_130._0_8_ = (_Elt_pointer)(local_130 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"resV","");
    BuilderContext::makeTempLocalReg((BuilderContext *)local_1e0,(string *)pBVar3);
    if ((_Elt_pointer)local_130._0_8_ != (_Elt_pointer)(local_130 + 0x10)) {
      operator_delete((void *)local_130._0_8_,
                      (ulong)((long)(_List_node_base **)local_130._16_8_ + 1));
    }
    pBVar3 = this->ctx;
    local_168.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1e0._0_8_;
    local_168.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_1e0._8_8_ + 8) = *(int *)(local_1e0._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_1e0._8_8_ + 8) = *(int *)(local_1e0._8_8_ + 8) + 1;
      }
    }
    BuilderContext::setExprAddr(pBVar3,(NodeID)node,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar6 = (this->ctx->logicalExprInfo).empty;
    (this->ctx->logicalExprInfo).empty = true;
    peVar2 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
              (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    sVar10 = BuilderContext::getExprAddr((BuilderContext *)local_198,(NodeID)this->ctx);
    (this->ctx->logicalExprInfo).empty = true;
    peVar2 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
              (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0),
               sVar10.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    pBVar3 = this->ctx;
    (pBVar3->logicalExprInfo).empty = bVar6;
    BuilderContext::getExprAddr((BuilderContext *)local_1a8,(NodeID)pBVar3);
    BuilderContext::getExprType((BuilderContext *)local_130,(NodeID)this->ctx);
    bVar6 = isStrTy(this,(shared_ptr<mocker::ast::Type> *)local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    }
    if (bVar6) {
      if ((operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_ == '\0') &&
         (iVar7 = __cxa_guard_acquire(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_)
         , iVar7 != 0)) {
        uStack_1ef = 0x69727473;
        uStack_1eb = 0x23676e;
        local_1e8._0_1_ = true;
        local_1e8._1_3_ = 0x617571;
        local_1e4 = 0x6c;
        local_1e3 = 0;
        local_130._8_8_ = &aStack_118;
        local_130._0_4_ = 6;
        aStack_118._M_allocated_capacity = (size_type)(_Elt_pointer)0x23676e6972747323;
        aStack_118._14_2_ = local_1e2;
        aStack_118._8_6_ = 0x6c61757165;
        local_130._16_8_ = (_List_node_base *)0xd;
        local_200._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_200[0x10] = 0;
        local_144[4] = 7;
        local_200._0_8_ = (element_type *)(local_200 + 0x10);
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[16],_true>
                  ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&psStack_108,local_144 + 4,(char (*) [16])"#string#inequal");
        local_144[3] = 10;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[19],_true>
                  (&local_e0,local_144 + 3,(char (*) [19])"#string#less_equal");
        local_144[2] = 8;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[13],_true>
                  (&local_b8,local_144 + 2,(char (*) [13])"#string#less");
        local_144[1] = 0xb;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[19],_true>
                  (&local_90,local_144 + 1,(char (*) [19])"#string#less_equal");
        local_144[0] = Gt;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[13],_true>
                  (&local_68,local_144,(char (*) [13])"#string#less");
        local_40._M_len = 6;
        local_40._M_array = (iterator)local_130;
        SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SmallMap(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,&local_40);
        lVar9 = -0xf0;
        paVar8 = &local_68.second.field_2;
        do {
          if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar8->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                            paVar8->_M_allocated_capacity + 1);
          }
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(&paVar8->_M_allocated_capacity + -5);
          lVar9 = lVar9 + 0x28;
        } while (lVar9 != 0);
        if ((element_type *)local_200._0_8_ != (element_type *)(local_200 + 0x10)) {
          operator_delete((void *)local_200._0_8_,
                          CONCAT35(uStack_1eb,CONCAT41(uStack_1ef,local_200[0x10])) + 1);
        }
        __cxa_atexit(SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::~SmallMap,&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_);
      }
      uVar5 = local_198._8_8_;
      uVar4 = local_198._0_8_;
      if ((*k | LogicalAnd) == Ge) {
        local_198._0_8_ = local_1a8._0_8_;
        local_198._8_8_ = local_1a8._8_8_;
        local_1a8._0_8_ = uVar4;
        local_1a8._8_8_ = uVar5;
      }
      pBVar3 = this->ctx;
      args_1_00 = SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::at(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,k);
      BuilderContext::
      emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,std::__cxx11::string_const&,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                (pBVar3,(shared_ptr<mocker::ir::Reg> *)local_1e0,args_1_00,
                 (shared_ptr<mocker::ir::Addr> *)local_198,(shared_ptr<mocker::ir::Addr> *)local_1a8
                );
    }
    else {
      BuilderContext::
      emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType&,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                (this->ctx,(shared_ptr<mocker::ir::Reg> *)local_1e0,(OpType *)(local_1e0 + 0x14),
                 (shared_ptr<mocker::ir::Addr> *)local_198,(shared_ptr<mocker::ir::Addr> *)local_1a8
                );
    }
    BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
  }
  else {
    if (node->op - LogicalOr < 2) {
      translateLogicBinary(this,node);
      goto LAB_0013e8b9;
    }
    BuilderContext::getExprType((BuilderContext *)local_130,(NodeID)this->ctx);
    bVar6 = isStrTy(this,(shared_ptr<mocker::ast::Type> *)local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
    }
    if (bVar6) {
      bVar6 = (this->ctx->logicalExprInfo).empty;
      (this->ctx->logicalExprInfo).empty = true;
      peVar2 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
                (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      peVar2 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
                (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      pBVar3 = this->ctx;
      (pBVar3->logicalExprInfo).empty = bVar6;
      local_130._0_8_ = (_Elt_pointer)(local_130 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"newStr","");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_200,(string *)pBVar3);
      if ((_Elt_pointer)local_130._0_8_ != (_Elt_pointer)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,
                        (ulong)((long)(_List_node_base **)local_130._16_8_ + 1));
      }
      pBVar3 = this->ctx;
      BuilderContext::getExprAddr((BuilderContext *)local_130,(NodeID)pBVar3);
      BuilderContext::getExprAddr((BuilderContext *)local_1e0,(NodeID)this->ctx);
      BuilderContext::
      emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
                (pBVar3,(shared_ptr<mocker::ir::Reg> *)local_200,(char (*) [12])"#string#add",
                 (shared_ptr<mocker::ir::Addr> *)local_130,(shared_ptr<mocker::ir::Addr> *)local_1e0
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
      }
      pBVar3 = this->ctx;
      local_178.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_200._0_8_;
      local_178.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
        }
      }
      BuilderContext::setExprAddr(pBVar3,(NodeID)node,&local_178);
      this_00._M_pi =
           local_178.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
    else {
      if ((operator()(mocker::ast::BinaryExpr_const&)::opMap == '\0') &&
         (iVar7 = __cxa_guard_acquire(&operator()(mocker::ast::BinaryExpr_const&)::opMap),
         iVar7 != 0)) {
        local_130._0_8_ = (_Elt_pointer)0x3;
        local_130._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x100000004;
        local_130._16_8_ = (_List_node_base *)0x200000005;
        aStack_118._M_allocated_capacity = 0x30000000c;
        aStack_118._8_8_ = (_Elt_pointer)0x40000000d;
        psStack_108 = (_Elt_pointer)0x50000000e;
        local_100._M_nxt = (_Hash_node_base *)0x60000000f;
        psStack_f8 = (_Elt_pointer)0x700000010;
        local_f0._M_allocated_capacity = 0x800000011;
        local_f0._8_8_ = (_Elt_pointer)0x900000012;
        local_200._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xa;
        local_200._0_8_ = (element_type *)local_130;
        SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::SmallMap
                  (&operator()(mocker::ast::BinaryExpr_const&)::opMap,
                   (initializer_list<std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>_>
                    *)local_200);
        __cxa_atexit(SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>
                     ::~SmallMap,&operator()(mocker::ast::BinaryExpr_const&)::opMap,&__dso_handle);
        __cxa_guard_release(&operator()(mocker::ast::BinaryExpr_const&)::opMap);
      }
      bVar6 = (this->ctx->logicalExprInfo).empty;
      (this->ctx->logicalExprInfo).empty = true;
      peVar2 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
                (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      peVar2 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
                (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      pBVar3 = this->ctx;
      (pBVar3->logicalExprInfo).empty = bVar6;
      local_130._0_8_ = (_Elt_pointer)(local_130 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"");
      BuilderContext::makeTempLocalReg((BuilderContext *)local_200,(string *)pBVar3);
      if ((_Elt_pointer)local_130._0_8_ != (_Elt_pointer)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,
                        (ulong)((long)(_List_node_base **)local_130._16_8_ + 1));
      }
      pBVar3 = this->ctx;
      args_1 = SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::at
                         (&operator()(mocker::ast::BinaryExpr_const&)::opMap,k);
      BuilderContext::getExprAddr((BuilderContext *)local_130,(NodeID)this->ctx);
      BuilderContext::getExprAddr((BuilderContext *)local_1e0,(NodeID)this->ctx);
      BuilderContext::
      emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType_const&,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
                (pBVar3,(shared_ptr<mocker::ir::Reg> *)local_200,args_1,
                 (shared_ptr<mocker::ir::Addr> *)local_130,(shared_ptr<mocker::ir::Addr> *)local_1e0
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
      }
      pBVar3 = this->ctx;
      local_198._16_8_ = local_200._0_8_;
      local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_200._8_8_ + 8) = *(int *)(local_200._8_8_ + 8) + 1;
        }
      }
      BuilderContext::setExprAddr
                (pBVar3,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)(local_198 + 0x10));
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180;
    }
    local_1e0._8_8_ = local_200._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)this_00._M_pi !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      local_1e0._8_8_ = local_200._8_8_;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._8_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
  }
LAB_0013e8b9:
  Defer::~Defer((Defer *)(local_1e0 + 0x18));
  return;
}

Assistant:

void Builder::operator()(const ast::BinaryExpr &node) const {
  using namespace std::string_literals;
  if (node.op == ast::BinaryExpr::Assign) {
    visit(*node.rhs);
    auto rhsVal = ctx.getExprAddr(node.rhs->getID());
    auto lhsAddr = getElementPtr(node.lhs);
    ctx.emplaceInst<Store>(lhsAddr, rhsVal);
    return;
  }
  if (node.op == ast::BinaryExpr::Subscript ||
      node.op == ast::BinaryExpr::Member) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    auto addr = getElementPtr(std::static_pointer_cast<ast::Expression>(
        const_cast<ast::BinaryExpr &>(node).shared_from_this()));
    ctx.getLogicalExprInfo().empty = bak;
    auto val = ctx.makeTempLocalReg("valOrInstPtr");
    ctx.emplaceInst<Load>(val, addr);
    ctx.setExprAddr(node.getID(), val);
    ctx.checkLogicalExpr(node);
    return;
  }

  Defer defer([&node, this] {
    if (ctx.isTrivial(node.lhs) && ctx.isTrivial(node.rhs))
      ctx.markExprTrivial(node);
  });

  // Eq, Ne, Lt, Gt, Le, Ge,
  if (ast::BinaryExpr::Eq <= node.op && node.op <= ast::BinaryExpr::Ge) {
    auto op = (RelationInst::OpType)(RelationInst::Eq +
                                     (node.op - ast::BinaryExpr::Eq));
    auto val = ctx.makeTempLocalReg("resV");
    ctx.setExprAddr(node.getID(), val);

    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.lhs);
    auto lhs = ctx.getExprAddr(node.lhs->getID());
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.rhs);
    ctx.getLogicalExprInfo().empty = bak;
    auto rhs = ctx.getExprAddr(node.rhs->getID());

    if (isStrTy(ctx.getExprType(node.lhs->getID()))) {
      static SmallMap<ast::BinaryExpr::OpType, std::string> opMap{
          {ast::BinaryExpr::Eq, "#string#equal"s},
          {ast::BinaryExpr::Ne, "#string#inequal"},
          {ast::BinaryExpr::Le, "#string#less_equal"},
          {ast::BinaryExpr::Lt, "#string#less"},
          {ast::BinaryExpr::Ge, "#string#less_equal"},
          {ast::BinaryExpr::Gt, "#string#less"},
      };
      if (node.op == ast::BinaryExpr::Ge || node.op == ast::BinaryExpr::Gt) {
        std::swap(lhs, rhs);
      }
      ctx.emplaceInst<Call>(val, opMap.at(node.op), lhs, rhs);
    } else {
      ctx.emplaceInst<RelationInst>(val, op, lhs, rhs);
    }

    ctx.checkLogicalExpr(node);
    return;
  }
  if (node.op == ast::BinaryExpr::LogicalAnd ||
      node.op == ast::BinaryExpr::LogicalOr) {
    translateLogicBinary(node);
    return;
  }
  // string
  if (isStrTy(ctx.getExprType(node.getID()))) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.lhs);
    visit(*node.rhs);
    ctx.getLogicalExprInfo().empty = bak;
    auto res = ctx.makeTempLocalReg("newStr");
    ctx.emplaceInst<Call>(res, "#string#add",
                          ctx.getExprAddr(node.lhs->getID()),
                          ctx.getExprAddr(node.rhs->getID()));
    ctx.setExprAddr(node.getID(), res);
    return;
  }

  static SmallMap<ast::BinaryExpr::OpType, ArithBinaryInst::OpType> opMap{
      {ast::BinaryExpr::BitOr, ArithBinaryInst::BitOr},
      {ast::BinaryExpr::BitAnd, ArithBinaryInst::BitAnd},
      {ast::BinaryExpr::Xor, ArithBinaryInst::Xor},
      {ast::BinaryExpr::Shl, ArithBinaryInst::Shl},
      {ast::BinaryExpr::Shr, ArithBinaryInst::Shr},
      {ast::BinaryExpr::Add, ArithBinaryInst::Add},
      {ast::BinaryExpr::Sub, ArithBinaryInst::Sub},
      {ast::BinaryExpr::Mul, ArithBinaryInst::Mul},
      {ast::BinaryExpr::Div, ArithBinaryInst::Div},
      {ast::BinaryExpr::Mod, ArithBinaryInst::Mod},
  };
  auto bak = ctx.getLogicalExprInfo().empty;
  ctx.getLogicalExprInfo().empty = true;
  visit(*node.lhs);
  visit(*node.rhs);
  ctx.getLogicalExprInfo().empty = bak;
  auto res = ctx.makeTempLocalReg();
  ctx.emplaceInst<ArithBinaryInst>(res, opMap.at(node.op),
                                   ctx.getExprAddr(node.lhs->getID()),
                                   ctx.getExprAddr(node.rhs->getID()));
  ctx.setExprAddr(node.getID(), res);
}